

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_align.c
# Opt level: O1

int32 id_cmp(char *str1,char *str2)

{
  char cVar1;
  long lVar2;
  char cVar3;
  char cVar4;
  
  lVar2 = 0;
  while( true ) {
    cVar1 = str1[lVar2];
    cVar3 = cVar1 + -0x20;
    if (0x19 < (byte)(cVar1 + 0x9fU)) {
      cVar3 = cVar1;
    }
    cVar1 = str2[lVar2];
    cVar4 = cVar1 + -0x20;
    if (0x19 < (byte)(cVar1 + 0x9fU)) {
      cVar4 = cVar1;
    }
    if (cVar3 != cVar4) break;
    lVar2 = lVar2 + 1;
    if (cVar3 == '\0') {
      return 0;
    }
  }
  return (int)cVar3 - (int)cVar4;
}

Assistant:

static int32
id_cmp(char *str1, char *str2)
{
    char c1, c2;

    for (;;) {
        c1 = *(str1++);
        c1 = UPPER_CASE(c1);
        c2 = *(str2++);
        c2 = UPPER_CASE(c2);
        if (c1 != c2)
            return (c1 - c2);
        if (c1 == '\0')
            return 0;
    }
}